

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O2

void duckdb::SetSelectionVectorWhere::GetResultLength
               (DataChunk *args,idx_t *result_length,list_entry_t *selection_data,
               Vector *selection_entry,idx_t selection_idx)

{
  bool bVar1;
  InvalidInputException *this;
  list_entry_t *plVar2;
  ulong uVar3;
  allocator local_71;
  Value local_70;
  
  plVar2 = selection_data + selection_idx;
  uVar3 = 0;
  while( true ) {
    if (plVar2->length <= uVar3) {
      return;
    }
    Vector::GetValue(&local_70,selection_entry,plVar2->offset + uVar3);
    bVar1 = local_70.is_null;
    Value::~Value(&local_70);
    if (bVar1 == true) break;
    Vector::GetValue(&local_70,selection_entry,plVar2->offset + uVar3);
    bVar1 = Value::GetValue<bool>(&local_70);
    Value::~Value(&local_70);
    if (bVar1) {
      *result_length = *result_length + 1;
    }
    uVar3 = uVar3 + 1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_70,
             "NULLs are not allowed as list elements in the second input parameter.",&local_71);
  InvalidInputException::InvalidInputException(this,(string *)&local_70);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void GetResultLength(DataChunk &args, idx_t &result_length, const list_entry_t *selection_data,
	                            Vector selection_entry, idx_t selection_idx) {
		for (idx_t child_idx = 0; child_idx < selection_data[selection_idx].length; child_idx++) {
			if (selection_entry.GetValue(selection_data[selection_idx].offset + child_idx).IsNull()) {
				throw InvalidInputException("NULLs are not allowed as list elements in the second input parameter.");
			}
			if (selection_entry.GetValue(selection_data[selection_idx].offset + child_idx).GetValue<bool>()) {
				result_length++;
			}
		}
	}